

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::checkCallGraphBodies
          (TIntermediate *this,TInfoSink *infoSink,bool keepUncalled)

{
  _Bit_pointer this_00;
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  TIntermNode *pTVar4;
  undefined4 extraout_var;
  size_type sVar5;
  reference ppTVar6;
  TIntermOperator *this_01;
  undefined4 extraout_var_01;
  char *pcVar7;
  pointer pTVar8;
  undefined4 extraout_var_02;
  pointer __rhs;
  TInfoSinkBase *pTVar9;
  undefined4 extraout_var_03;
  TString *deadCaller;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_138;
  const_iterator local_130;
  void *local_128;
  TIntermNode **local_120;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_118;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_110;
  const_iterator local_108;
  reference local_100;
  int local_ec;
  undefined1 auStack_e8 [4];
  int f_1;
  _Self local_d8;
  _Self local_d0;
  iterator call_3;
  _Self local_c0;
  iterator call2;
  _Self local_b0;
  iterator call1;
  iterator iStack_a0;
  bool changed;
  _Self local_98;
  iterator call_2;
  _Self local_88;
  iterator call_1;
  TIntermAggregate *node;
  int f;
  vector<bool,_std::allocator<bool>_> reachable;
  TIntermSequence *functionSequence;
  _Self local_28;
  iterator call;
  bool keepUncalled_local;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  undefined4 extraout_var_00;
  
  call._M_node._7_1_ = keepUncalled;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::begin(&this->callGraph);
  while( true ) {
    functionSequence =
         (TIntermSequence *)
         std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::end(&this->callGraph);
    bVar1 = std::operator!=(&local_28,(_Self *)&functionSequence);
    if (!bVar1) break;
    pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_28);
    pTVar8->visited = false;
    pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_28);
    pTVar8->calleeBodyPosition = -1;
    std::_List_iterator<glslang::TCall>::operator++(&local_28);
  }
  pTVar4 = getTreeRoot(this);
  iVar2 = (*pTVar4->_vptr_TIntermNode[6])();
  reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 400))();
  sVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                    ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                     reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage);
  node._7_1_ = 1;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&node + 6));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&f,sVar5,(bool *)((long)&node + 7),
             (allocator_type *)((long)&node + 6));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&node + 6));
  for (node._0_4_ = 0; iVar2 = (int)node,
      sVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                        ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                         reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage), iVar2 < (int)sVar5;
      node._0_4_ = (int)node + 1) {
    ppTVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                         reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,(long)(int)node);
    iVar2 = (*(*ppTVar6)->_vptr_TIntermNode[6])();
    this_01 = (TIntermOperator *)CONCAT44(extraout_var_00,iVar2);
    if ((this_01 != (TIntermOperator *)0x0) &&
       (TVar3 = TIntermOperator::getOp(this_01), TVar3 == EOpFunction)) {
      iVar2 = (*(this_01->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x35])();
      getEntryPointMangledName_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_01,iVar2),pcVar7);
      if (iVar2 != 0) {
        _call_1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)&f,(long)(int)node);
        std::_Bit_reference::operator=((_Bit_reference *)&call_1,false);
      }
      local_88._M_node =
           (_List_node_base *)
           std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::begin
                     (&this->callGraph);
      while( true ) {
        call_2 = std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::end
                           (&this->callGraph);
        bVar1 = std::operator!=(&local_88,&call_2);
        if (!bVar1) break;
        pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_88);
        iVar2 = (*(this_01->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x35])();
        bVar1 = std::operator==(&pTVar8->callee,
                                (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_02,iVar2));
        iVar2 = (int)node;
        if (bVar1) {
          pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_88);
          pTVar8->calleeBodyPosition = iVar2;
        }
        std::_List_iterator<glslang::TCall>::operator++(&local_88);
      }
    }
  }
  local_98._M_node =
       (_List_node_base *)
       std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::begin(&this->callGraph);
  while( true ) {
    iStack_a0 = std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::end
                          (&this->callGraph);
    bVar1 = std::operator!=(&local_98,&stack0xffffffffffffff60);
    if (!bVar1) break;
    pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_98);
    getEntryPointMangledName_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(&pTVar8->caller,pcVar7);
    if (iVar2 == 0) {
      pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_98);
      pTVar8->visited = true;
    }
    std::_List_iterator<glslang::TCall>::operator++(&local_98);
  }
  do {
    call1._M_node._7_1_ = 0;
    local_b0._M_node =
         (_List_node_base *)
         std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::begin
                   (&this->callGraph);
    while( true ) {
      call2 = std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::end
                        (&this->callGraph);
      bVar1 = std::operator!=(&local_b0,&call2);
      if (!bVar1) break;
      pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_b0);
      if ((pTVar8->visited & 1U) != 0) {
        local_c0._M_node =
             (_List_node_base *)
             std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::begin
                       (&this->callGraph);
        while( true ) {
          call_3 = std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::end
                             (&this->callGraph);
          bVar1 = std::operator!=(&local_c0,&call_3);
          if (!bVar1) break;
          pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_c0);
          if ((pTVar8->visited & 1U) == 0) {
            pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_b0);
            __rhs = std::_List_iterator<glslang::TCall>::operator->(&local_c0);
            bVar1 = std::operator==(&pTVar8->callee,&__rhs->caller);
            if (bVar1) {
              call1._M_node._7_1_ = 1;
              pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_c0);
              pTVar8->visited = true;
            }
          }
          std::_List_iterator<glslang::TCall>::operator++(&local_c0);
        }
      }
      std::_List_iterator<glslang::TCall>::operator++(&local_b0);
    }
  } while ((call1._M_node._7_1_ & 1) != 0);
  local_d0._M_node =
       (_List_node_base *)
       std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::begin(&this->callGraph);
  while( true ) {
    local_d8._M_node =
         (_List_node_base *)
         std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::end(&this->callGraph);
    bVar1 = std::operator!=(&local_d0,&local_d8);
    if (!bVar1) break;
    pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_d0);
    if ((pTVar8->visited & 1U) != 0) {
      pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_d0);
      if (pTVar8->calleeBodyPosition == -1) {
        error(this,infoSink,"No function definition (body) found: ",EShLangCount);
        pTVar9 = TInfoSinkBase::operator<<(&infoSink->info,"    ");
        pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_d0);
        pTVar9 = TInfoSinkBase::operator<<(pTVar9,&pTVar8->callee);
        TInfoSinkBase::operator<<(pTVar9,"\n");
      }
      else {
        pTVar8 = std::_List_iterator<glslang::TCall>::operator->(&local_d0);
        _auStack_e8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)&f,
                                 (long)pTVar8->calleeBodyPosition);
        std::_Bit_reference::operator=((_Bit_reference *)auStack_e8,true);
      }
    }
    std::_List_iterator<glslang::TCall>::operator++(&local_d0);
  }
  if ((call._M_node._7_1_ & 1) == 0) {
    for (local_ec = 0; iVar2 = local_ec,
        sVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage),
        this_00 = reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage, iVar2 < (int)sVar5;
        local_ec = local_ec + 1) {
      local_100 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)&f,(long)local_ec);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_100);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        ppTVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                             reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage,(long)local_ec);
        iVar2 = (*(*ppTVar6)->_vptr_TIntermNode[6])();
        deadCaller = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x1a8))();
        resetTopLevelUncalledStatus(this,deadCaller);
        ppTVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                             reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage,(long)local_ec);
        *ppTVar6 = (value_type)0x0;
      }
    }
    local_118._M_current =
         (TIntermNode **)
         std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                   ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
    local_120 = (TIntermNode **)
                std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage);
    local_128 = (void *)0x0;
    local_110 = std::
                remove<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,decltype(nullptr)>
                          (local_118,
                           (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                            )local_120,&local_128);
    __gnu_cxx::
    __normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
    ::__normal_iterator<TIntermNode**>
              ((__normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
                *)&local_108,&local_110);
    local_138._M_current =
         (TIntermNode **)
         std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                   ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    reachable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
    ::__normal_iterator<TIntermNode**>
              ((__normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
                *)&local_130,&local_138);
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::erase
              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)this_00,local_108,
               local_130);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&f);
  return;
}

Assistant:

void TIntermediate::checkCallGraphBodies(TInfoSink& infoSink, bool keepUncalled)
{
    // Clear fields we'll use for this.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        call->visited = false;
        call->calleeBodyPosition = -1;
    }

    // The top level of the AST includes function definitions (bodies).
    // Compare these to function calls in the call graph.
    // We'll end up knowing which have bodies, and if so,
    // how to map the call-graph node to the location in the AST.
    TIntermSequence &functionSequence = getTreeRoot()->getAsAggregate()->getSequence();
    std::vector<bool> reachable(functionSequence.size(), true); // so that non-functions are reachable
    for (int f = 0; f < (int)functionSequence.size(); ++f) {
        glslang::TIntermAggregate* node = functionSequence[f]->getAsAggregate();
        if (node && (node->getOp() == glslang::EOpFunction)) {
            if (node->getName().compare(getEntryPointMangledName().c_str()) != 0)
                reachable[f] = false; // so that function bodies are unreachable, until proven otherwise
            for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
                if (call->callee == node->getName())
                    call->calleeBodyPosition = f;
            }
        }
    }

    // Start call-graph traversal by visiting the entry point nodes.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        if (call->caller.compare(getEntryPointMangledName().c_str()) == 0)
            call->visited = true;
    }

    // Propagate 'visited' through the call-graph to every part of the graph it
    // can reach (seeded with the entry-point setting above).
    bool changed;
    do {
        changed = false;
        for (auto call1 = callGraph.begin(); call1 != callGraph.end(); ++call1) {
            if (call1->visited) {
                for (TGraph::iterator call2 = callGraph.begin(); call2 != callGraph.end(); ++call2) {
                    if (! call2->visited) {
                        if (call1->callee == call2->caller) {
                            changed = true;
                            call2->visited = true;
                        }
                    }
                }
            }
        }
    } while (changed);

    // Any call-graph node set to visited but without a callee body is an error.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        if (call->visited) {
            if (call->calleeBodyPosition == -1) {
                error(infoSink, "No function definition (body) found: ");
                infoSink.info << "    " << call->callee << "\n";
            } else
                reachable[call->calleeBodyPosition] = true;
        }
    }

    // Bodies in the AST not reached by the call graph are dead;
    // clear them out, since they can't be reached and also can't
    // be translated further due to possibility of being ill defined.
    if (! keepUncalled) {
        for (int f = 0; f < (int)functionSequence.size(); ++f) {
            if (! reachable[f])
            {
                resetTopLevelUncalledStatus(functionSequence[f]->getAsAggregate()->getName());
                functionSequence[f] = nullptr;
            }
        }
        functionSequence.erase(std::remove(functionSequence.begin(), functionSequence.end(), nullptr), functionSequence.end());
    }
}